

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int key_schedule_select_one(ptls_key_schedule_t *sched,ptls_cipher_suite_t *cs,int reset)

{
  ptls_iovec_t ikm;
  int iVar1;
  int in_EDX;
  long in_RSI;
  int *in_RDI;
  int ret;
  size_t i;
  size_t found_slot;
  size_t in_stack_00000048;
  long local_28;
  long local_20;
  int local_14;
  
  local_20 = -1;
  if (*in_RDI != 1) {
    __assert_fail("sched->generation == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/deps/picotls/lib/picotls.c"
                  ,0x3b5,
                  "int key_schedule_select_one(ptls_key_schedule_t *, ptls_cipher_suite_t *, int)");
  }
  for (local_28 = 0; local_28 != *(long *)(in_RDI + 0x14); local_28 = local_28 + 1) {
    if (*(long *)(in_RDI + local_28 * 4 + 0x16) == *(long *)(in_RSI + 0x10)) {
      if (local_20 != -1) {
        __assert_fail("found_slot == SIZE_MAX",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/deps/picotls/lib/picotls.c"
                      ,0x3ba,
                      "int key_schedule_select_one(ptls_key_schedule_t *, ptls_cipher_suite_t *, int)"
                     );
      }
      local_20 = local_28;
    }
    else {
      (**(code **)(*(long *)(in_RDI + local_28 * 4 + 0x18) + 8))
                (*(undefined8 *)(in_RDI + local_28 * 4 + 0x18),0,0);
    }
  }
  local_14 = in_EDX;
  if (local_20 != 0) {
    *(undefined8 *)(in_RDI + 0x16) = *(undefined8 *)(in_RDI + local_20 * 4 + 0x16);
    *(undefined8 *)(in_RDI + 0x18) = *(undefined8 *)(in_RDI + local_20 * 4 + 0x16 + 2);
    local_14 = 1;
  }
  in_RDI[0x14] = 1;
  in_RDI[0x15] = 0;
  if (local_14 != 0) {
    *in_RDI = *in_RDI + -1;
    memset(in_RDI + 4,0,0x40);
    ptls_iovec_init((void *)0x0,0);
    ikm.len = in_stack_00000048;
    ikm.base = (uint8_t *)sched;
    iVar1 = key_schedule_extract((ptls_key_schedule_t *)cs,ikm);
    if (iVar1 != 0) {
      return iVar1;
    }
  }
  return 0;
}

Assistant:

static int key_schedule_select_one(ptls_key_schedule_t *sched, ptls_cipher_suite_t *cs, int reset)
{
    size_t found_slot = SIZE_MAX, i;
    int ret;

    assert(sched->generation == 1);

    /* find the one, while freeing others */
    for (i = 0; i != sched->num_hashes; ++i) {
        if (sched->hashes[i].algo == cs->hash) {
            assert(found_slot == SIZE_MAX);
            found_slot = i;
        } else {
            sched->hashes[i].ctx->final(sched->hashes[i].ctx, NULL, PTLS_HASH_FINAL_MODE_FREE);
        }
    }
    if (found_slot != 0) {
        sched->hashes[0] = sched->hashes[found_slot];
        reset = 1;
    }
    sched->num_hashes = 1;

    /* recalculate the hash if a different hash as been selected than the one we used for calculating the early secrets */
    if (reset) {
        --sched->generation;
        memset(sched->secret, 0, sizeof(sched->secret));
        if ((ret = key_schedule_extract(sched, ptls_iovec_init(NULL, 0))) != 0)
            goto Exit;
    }

    ret = 0;
Exit:
    return ret;
}